

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ssize_t __thiscall Jupiter::Socket::recv(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Data *pDVar1;
  ssize_t sVar2;
  
  pDVar1 = this->m_data;
  (pDVar1->buffer).m_buffer_size = 0;
  sVar2 = ::recv(pDVar1->rawSock,(pDVar1->buffer).m_buffer,(pDVar1->buffer).m_buffer_capacity,0);
  if (0 < (int)(uint)sVar2) {
    (this->m_data->buffer).m_buffer_size = (ulong)((uint)sVar2 & 0x7fffffff);
  }
  return sVar2;
}

Assistant:

int Jupiter::Socket::recv() {
	m_data->buffer.clear();
	int r = ::recv(m_data->rawSock, m_data->buffer.chr_data(), m_data->buffer.capacity(), 0);
	if (r > 0) {
		m_data->buffer.set_length(r);
	}
	return r;
}